

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * json::operator<<(ostream *os,Object *object)

{
  ostream *poVar1;
  string local_38 [32];
  Object *local_18;
  Object *object_local;
  ostream *os_local;
  
  local_18 = object;
  object_local = (Object *)os;
  (*(object->super_Type)._vptr_Type[1])();
  poVar1 = std::operator<<(os,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Object const& object) {
            return os << object.stringify();
        }